

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O1

idx_t duckdb::HandleInsertConflicts<false>
                (TableCatalogEntry *table,ExecutionContext *context,InsertLocalState *lstate,
                InsertGlobalState *gstate,DataChunk *tuples,PhysicalInsert *op)

{
  DataChunk *input;
  ClientContext *context_00;
  ulong uVar1;
  ulong uVar2;
  _func_int **pp_Var3;
  data_ptr_t pdVar4;
  bool bVar5;
  int iVar6;
  pointer __p;
  undefined4 extraout_var;
  LocalStorage *pLVar8;
  optional_ptr<duckdb::LocalTableStorage,_true> oVar9;
  TableIndexList *pTVar10;
  idx_t iVar11;
  ManagedSelection *pMVar12;
  TableCatalogEntry *table_00;
  pointer __p_00;
  type fetch_state_00;
  undefined4 extraout_var_00;
  reference pvVar13;
  reference pvVar14;
  const_reference pvVar15;
  InternalException *this;
  pointer pVVar16;
  ulong uVar17;
  ulong uVar18;
  PhysicalInsert *op_00;
  ulong uVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  size_type __n;
  size_type __n_00;
  unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
  fetch_state;
  SelectionVector sel_vec;
  DataChunk combined_chunk;
  DataChunk conflict_chunk;
  DataChunk scan_chunk;
  DataChunk conflict_condition_result;
  ConflictInfo conflict_info;
  ConflictManager conflict_manager;
  __uniq_ptr_impl<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>
  local_2e0;
  DataChunk *local_2d8;
  InsertGlobalState *local_2d0;
  undefined1 local_2c8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  SelectionVector local_2b0;
  SelectionVector *local_298;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_278;
  DataChunk local_270;
  DataChunk local_230;
  string local_1f0;
  undefined1 local_1d0 [64];
  DataChunk local_190;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_150;
  undefined1 local_148;
  ConflictManager local_140;
  DataTable *pDVar7;
  
  op_00 = op;
  local_2d0 = gstate;
  iVar6 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
            [0x10])();
  pDVar7 = (DataTable *)CONCAT44(extraout_var,iVar6);
  pLVar8 = LocalStorage::Get(context->client,pDVar7->db);
  local_148 = 1;
  local_150.ptr = (TableCatalogEntry *)&op->conflict_target;
  ConflictManager::ConflictManager(&local_140,APPEND,tuples->count,(ConflictInfo *)&local_150);
  oVar9 = LocalStorage::GetStorage(pLVar8,pDVar7);
  pTVar10 = LocalStorage::GetIndexes(pLVar8,context->client,pDVar7);
  DataTable::VerifyUniqueIndexes(pTVar10,oVar9,tuples,&local_140);
  ConflictManager::Finalize(&local_140);
  iVar11 = ConflictManager::ConflictCount(&local_140);
  if (iVar11 == 0) {
    p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    pMVar12 = ConflictManager::Conflicts(&local_140);
    table_00 = (TableCatalogEntry *)ConflictManager::RowIds(&local_140);
    DataChunk::DataChunk(&local_230);
    DataChunk::DataChunk((DataChunk *)local_1d0);
    DataChunk::DataChunk(&local_270);
    context_00 = context->client;
    DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)local_2c8,tuples);
    DataChunk::Initialize
              (&local_230,context_00,(vector<duckdb::LogicalType,_true> *)local_2c8,0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_2c8);
    DataChunk::Reference(&local_230,tuples);
    local_278._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&pMVar12->sel_vec;
    DataChunk::Slice(&local_230,(SelectionVector *)local_278._M_pi,pMVar12->count);
    local_230.count = pMVar12->count;
    local_2e0._M_t.
    super__Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
    .super__Head_base<0UL,_duckdb::ColumnFetchState_*,_false>._M_head_impl =
         (tuple<duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>)
         (_Tuple_impl<0UL,_duckdb::ColumnFetchState_*,_std::default_delete<duckdb::ColumnFetchState>_>
          )0x0;
    if ((op->types_to_fetch).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
        .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (op->types_to_fetch).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
        .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      DataChunk::Initialize((DataChunk *)local_1d0,context->client,&op->types_to_fetch,0x800);
      __p_00 = (pointer)operator_new(0x50);
      (__p_00->handles)._M_h._M_buckets = (__buckets_ptr)0x0;
      (__p_00->handles)._M_h._M_bucket_count = 0;
      *(undefined8 *)&(__p_00->handles)._M_h._M_rehash_policy = 0;
      (__p_00->handles)._M_h._M_rehash_policy._M_next_resize = 0;
      (__p_00->handles)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (__p_00->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p_00->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p_00->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__p_00->handles)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (__p_00->handles)._M_h._M_element_count = 0;
      (__p_00->handles)._M_h._M_buckets = &(__p_00->handles)._M_h._M_single_bucket;
      (__p_00->handles)._M_h._M_bucket_count = 1;
      (__p_00->handles)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (__p_00->handles)._M_h._M_rehash_policy._M_next_resize = 0;
      (__p_00->handles)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (__p_00->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__p_00->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p_00->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2c8._0_8_ =
           (__uniq_ptr_impl<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>
            )0x0;
      ::std::
      __uniq_ptr_impl<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>::
      reset(&local_2e0,__p_00);
      ::std::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>::
      ~unique_ptr((unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>
                   *)local_2c8);
      iVar11 = pMVar12->count;
      fetch_state_00 =
           unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
           ::operator*((unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
                        *)&local_2e0);
      op_00 = (PhysicalInsert *)local_1d0;
      LocalStorage::FetchChunk
                (pLVar8,pDVar7,(Vector *)table_00,iVar11,&op->columns_to_fetch,(DataChunk *)op_00,
                 fetch_state_00);
    }
    CombineExistingAndInsertTuples(&local_270,(DataChunk *)local_1d0,&local_230,context->client,op);
    InsertLocalState::GetConstraintState(lstate,pDVar7,table);
    if ((op->on_conflict_condition).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
      DataChunk::DataChunk((DataChunk *)(local_1d0 + 0x40));
      CheckOnConflictCondition
                (context,&local_270,&op->on_conflict_condition,(DataChunk *)(local_1d0 + 0x40));
      bVar5 = AllConflictsMeetCondition((DataChunk *)(local_1d0 + 0x40));
      if (!bVar5) {
        ManagedSelection::ManagedSelection((ManagedSelection *)local_2c8,local_270.count,true);
        pvVar13 = vector<duckdb::Vector,_true>::operator[]
                            ((vector<duckdb::Vector,_true> *)(local_1d0 + 0x40),0);
        if (local_270.count != 0) {
          pdVar4 = pvVar13->data;
          iVar11 = 0;
          pVVar16 = (pointer)local_2c8._8_8_;
          do {
            if (pdVar4[iVar11] == '\0') {
              if (local_298 != (SelectionVector *)0x0) {
                *(int *)((long)&((((buffer_ptr<VectorBuffer> *)&local_298->sel_vector)->internal).
                                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_vptr_VectorBuffer + (long)pVVar16 * 4) = (int)iVar11;
              }
              pVVar16 = (pointer)&pVVar16->field_0x1;
              local_2c8._8_8_ = pVVar16;
            }
            iVar11 = iVar11 + 1;
          } while (local_270.count != iVar11);
        }
        DataChunk::Slice(&local_270,&local_2b0,local_2c8._8_8_);
        pTVar10 = LocalStorage::GetIndexes(pLVar8,context->client,pDVar7);
        oVar9 = LocalStorage::GetStorage(pLVar8,pDVar7);
        DataTable::VerifyUniqueIndexes
                  (pTVar10,oVar9,tuples,(optional_ptr<duckdb::ConflictManager,_true>)0x0);
        this = (InternalException *)__cxa_allocate_exception(0x10);
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f0,"VerifyUniqueIndexes was expected to throw but didn\'t","");
        InternalException::InternalException(this,&local_1f0);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      DataChunk::~DataChunk((DataChunk *)(local_1d0 + 0x40));
    }
    if (&lstate->update_chunk == tuples) {
      RegisterUpdatedRows(lstate,(Vector *)table_00,local_270.count);
    }
    if (op->action_type == NOTHING) {
      p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      DataChunk::DataChunk((DataChunk *)local_2c8);
      CreateUpdateChunk(context,&local_270,table_00,(Vector *)local_2c8,(DataChunk *)op,op_00);
      iVar6 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                _vptr_CatalogEntry[0x10])();
      pDVar7 = (DataTable *)CONCAT44(extraout_var_00,iVar6);
      p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0.sel_vector;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0.sel_vector !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        input = &lstate->append_chunk;
        (lstate->append_chunk).count = (idx_t)local_2b0.sel_vector;
        local_2d8 = tuples;
        if ((lstate->append_chunk).data.
            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (lstate->append_chunk).data.
            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start) {
          __n_00 = 0;
          do {
            pvVar13 = vector<duckdb::Vector,_true>::operator[](&input->data,__n_00);
            pvVar14 = vector<duckdb::Vector,_true>::operator[](&local_270.data,__n_00);
            Vector::Reference(pvVar13,pvVar14);
            __n_00 = __n_00 + 1;
          } while (__n_00 < (ulong)(((long)(lstate->append_chunk).data.
                                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           .
                                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(lstate->append_chunk).data.
                                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           .
                                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   0x4ec4ec4ec4ec4ec5));
        }
        if ((op->set_columns).
            super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            (op->set_columns).
            super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          __n = 0;
          do {
            pvVar15 = vector<duckdb::PhysicalIndex,_true>::operator[](&op->set_columns,__n);
            pvVar13 = vector<duckdb::Vector,_true>::operator[](&input->data,pvVar15->index);
            pvVar14 = vector<duckdb::Vector,_true>::operator[]
                                ((vector<duckdb::Vector,_true> *)local_2c8,__n);
            Vector::Reference(pvVar13,pvVar14);
            __n = __n + 1;
          } while (__n < (ulong)((long)(op->set_columns).
                                       super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                       .
                                       super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(op->set_columns).
                                       super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                       .
                                       super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        if (op->update_is_del_and_insert == false) {
          if ((op->parallel == false) && (op->return_chunk == true)) {
            ColumnDataCollection::Append(&local_2d0->return_collection,input);
          }
          pLVar8 = LocalStorage::Get(context->client,pDVar7->db);
          LocalStorage::Update
                    (pLVar8,pDVar7,(Vector *)table_00,&op->set_columns,(DataChunk *)local_2c8);
          tuples = local_2d8;
          p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0.sel_vector;
        }
        else {
          pLVar8 = LocalStorage::Get(context->client,pDVar7->db);
          LocalStorage::Delete(pLVar8,pDVar7,(Vector *)table_00,(idx_t)local_2b0.sel_vector);
          if ((op->parallel == false) && (op->return_chunk == true)) {
            ColumnDataCollection::Append(&local_2d0->return_collection,input);
          }
          DataTable::LocalAppend
                    (pDVar7,table,context->client,input,&op->bound_constraints,(Vector *)table_00,
                     input);
          tuples = local_2d8;
          p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0.sel_vector;
        }
      }
      DataChunk::~DataChunk((DataChunk *)local_2c8);
    }
    SelectionVector::SelectionVector((SelectionVector *)local_2c8,tuples->count);
    uVar1 = tuples->count;
    if (uVar1 == 0) {
      iVar11 = 0;
    }
    else {
      uVar2 = pMVar12->count;
      pp_Var3 = (local_278._M_pi)->_vptr__Sp_counted_base;
      uVar17 = 0;
      iVar11 = 0;
      uVar18 = 0;
      do {
        if (uVar18 < uVar2) {
          uVar19 = uVar18;
          if (pp_Var3 != (_func_int **)0x0) {
            uVar19 = (ulong)*(uint *)((long)pp_Var3 + uVar18 * 4);
          }
          if (uVar17 != uVar19) goto LAB_0158ebd9;
          uVar18 = uVar18 + 1;
        }
        else {
LAB_0158ebd9:
          *(int *)((long)&(((buffer_handle_set_t *)local_2c8._0_8_)->_M_h)._M_buckets + iVar11 * 4)
               = (int)uVar17;
          iVar11 = iVar11 + 1;
        }
        uVar17 = uVar17 + 1;
      } while (uVar1 != uVar17);
    }
    DataChunk::Slice(tuples,(SelectionVector *)local_2c8,iVar11);
    tuples->count = iVar11;
    if ((pointer)local_2b8._M_pi != (pointer)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
    }
    ::std::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>::
    ~unique_ptr((unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>
                 *)&local_2e0);
    DataChunk::~DataChunk(&local_270);
    DataChunk::~DataChunk((DataChunk *)local_1d0);
    DataChunk::~DataChunk(&local_230);
  }
  ConflictManager::~ConflictManager(&local_140);
  return (idx_t)p_Var20;
}

Assistant:

static idx_t HandleInsertConflicts(TableCatalogEntry &table, ExecutionContext &context, InsertLocalState &lstate,
                                   InsertGlobalState &gstate, DataChunk &tuples, const PhysicalInsert &op) {
	auto &types_to_fetch = op.types_to_fetch;
	auto &on_conflict_condition = op.on_conflict_condition;
	auto &conflict_target = op.conflict_target;
	auto &columns_to_fetch = op.columns_to_fetch;
	auto &data_table = table.GetStorage();

	auto &local_storage = LocalStorage::Get(context.client, data_table.db);

	ConflictInfo conflict_info(conflict_target);
	ConflictManager conflict_manager(VerifyExistenceType::APPEND, tuples.size(), &conflict_info);
	auto storage = local_storage.GetStorage(data_table);
	if (GLOBAL) {
		auto &constraint_state = lstate.GetConstraintState(data_table, table);
		data_table.VerifyAppendConstraints(constraint_state, context.client, tuples, storage, &conflict_manager);
	} else {
		auto &indexes = local_storage.GetIndexes(context.client, data_table);
		DataTable::VerifyUniqueIndexes(indexes, storage, tuples, &conflict_manager);
	}

	conflict_manager.Finalize();
	if (conflict_manager.ConflictCount() == 0) {
		// No conflicts found, 0 updates performed
		return 0;
	}
	idx_t affected_tuples = 0;

	auto &conflicts = conflict_manager.Conflicts();
	auto &row_ids = conflict_manager.RowIds();

	DataChunk conflict_chunk; // contains only the conflicting values
	DataChunk scan_chunk;     // contains the original values, that caused the conflict
	DataChunk combined_chunk; // contains conflict_chunk + scan_chunk (wide)

	// Filter out everything but the conflicting rows
	conflict_chunk.Initialize(context.client, tuples.GetTypes());
	conflict_chunk.Reference(tuples);
	conflict_chunk.Slice(conflicts.Selection(), conflicts.Count());
	conflict_chunk.SetCardinality(conflicts.Count());

	// Holds the pins for the fetched rows
	unique_ptr<ColumnFetchState> fetch_state;
	if (!types_to_fetch.empty()) {
		D_ASSERT(scan_chunk.size() == 0);
		// When these values are required for the conditions or the SET expressions,
		// then we scan the existing table for the conflicting tuples, using the rowids
		scan_chunk.Initialize(context.client, types_to_fetch);
		fetch_state = make_uniq<ColumnFetchState>();
		if (GLOBAL) {
			auto &transaction = DuckTransaction::Get(context.client, table.catalog);
			data_table.Fetch(transaction, scan_chunk, columns_to_fetch, row_ids, conflicts.Count(), *fetch_state);
		} else {
			local_storage.FetchChunk(data_table, row_ids, conflicts.Count(), columns_to_fetch, scan_chunk,
			                         *fetch_state);
		}
	}

	// Splice the Input chunk and the fetched chunk together
	CombineExistingAndInsertTuples(combined_chunk, scan_chunk, conflict_chunk, context.client, op);

	auto &constraint_state = lstate.GetConstraintState(data_table, table);
	VerifyOnConflictCondition<GLOBAL>(context, combined_chunk, on_conflict_condition, constraint_state, tuples,
	                                  data_table, local_storage);

	if (&tuples == &lstate.update_chunk) {
		// Allow updating duplicate rows for the 'update_chunk'
		RegisterUpdatedRows(lstate, row_ids, combined_chunk.size());
	}

	affected_tuples += PerformOnConflictAction<GLOBAL>(lstate, gstate, context, combined_chunk, table, row_ids, op);

	// Remove the conflicting tuples from the insert chunk
	SelectionVector sel_vec(tuples.size());
	idx_t new_size = SelectionVector::Inverted(conflicts.Selection(), sel_vec, conflicts.Count(), tuples.size());
	tuples.Slice(sel_vec, new_size);
	tuples.SetCardinality(new_size);
	return affected_tuples;
}